

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_set_align_text(ps_decoder_t *ps,char *text)

{
  logmath_t *lmath;
  uint uVar1;
  s3wid_t sVar2;
  int wid;
  int iVar3;
  char *string;
  fsg_model_t *fsg;
  long ln;
  int32 iVar4;
  double dVar5;
  char delimfound;
  char *word;
  char local_41;
  char *local_40;
  char *local_38;
  
  string = __ckd_salloc__(text,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                          ,0x2ac);
  local_38 = string_trim(string,STRING_BOTH);
  uVar1 = nextword(local_38," \t\n\r",&local_40,&local_41);
  if ((int)uVar1 < 0) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    do {
      sVar2 = dict_wordid(ps->dict,local_40);
      if (sVar2 == -1) {
        ln = 0x2b7;
        goto LAB_0010d1d2;
      }
      local_40[uVar1] = local_41;
      uVar1 = nextword(local_40 + uVar1," \t\n\r",&local_40,&local_41);
      iVar4 = iVar4 + 1;
    } while (-1 < (int)uVar1);
  }
  lmath = ps->lmath;
  dVar5 = ps_config_float(ps->config,"lw");
  fsg = fsg_model_init("_align",lmath,(float32)(float)dVar5,iVar4);
  uVar1 = nextword(local_38," \t\n\r",&local_40,&local_41);
  if ((int)uVar1 < 0) {
    iVar4 = 0;
LAB_0010d178:
    ckd_free(local_38);
    fsg->start_state = 0;
    fsg->final_state = iVar4;
    iVar3 = ps_add_fsg(ps,"_align",fsg);
    fsg_model_free(fsg);
    if (iVar3 < 0) {
LAB_0010d1e8:
      iVar3 = -1;
    }
    else {
      iVar3 = ps_activate_search(ps,"_align");
    }
    return iVar3;
  }
  iVar3 = 0;
LAB_0010d0ef:
  sVar2 = dict_wordid(ps->dict,local_40);
  if (sVar2 != -1) goto code_r0x0010d10b;
  ln = 0x2c8;
LAB_0010d1d2:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
          ,ln,"Unknown word %s\n");
  ckd_free(local_38);
  goto LAB_0010d1e8;
code_r0x0010d10b:
  wid = fsg_model_word_add(fsg,local_40);
  iVar4 = iVar3 + 1;
  fsg_model_trans_add(fsg,iVar3,iVar4,0,wid);
  local_40[uVar1] = local_41;
  uVar1 = nextword(local_40 + uVar1," \t\n\r",&local_40,&local_41);
  iVar3 = iVar4;
  if ((int)uVar1 < 0) goto LAB_0010d178;
  goto LAB_0010d0ef;
}

Assistant:

int
ps_set_align_text(ps_decoder_t *ps, const char *text)
{
    fsg_model_t *fsg;
    char *textbuf = ckd_salloc(text);
    char *ptr, *word, delimfound;
    int n, nwords;

    textbuf = string_trim(textbuf, STRING_BOTH);
    /* First pass: count and verify words */
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    /* Second pass: make fsg */
    fsg = fsg_model_init("_align", ps->lmath,
                         ps_config_float(ps->config, "lw"),
                         nwords + 1);
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        wid = fsg_model_word_add(fsg, word);
        fsg_model_trans_add(fsg, nwords, nwords + 1, 0, wid);
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    ckd_free(textbuf);
    fsg->start_state = 0;
    fsg->final_state = nwords;
    if (ps_add_fsg(ps, PS_DEFAULT_ALIGN_SEARCH, fsg) < 0) {
        fsg_model_free(fsg);
        return -1;
    }
    fsg_model_free(fsg);
    return ps_activate_search(ps, PS_DEFAULT_ALIGN_SEARCH);
}